

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase56::run(TestCase56 *this)

{
  Own<kj::(anonymous_namespace)::Nested> *this_00;
  bool destroyed2;
  bool destroyed1;
  Own<kj::(anonymous_namespace)::Nested> nested;
  Own<kj::(anonymous_namespace)::Nested> local_18;
  
  destroyed1 = false;
  destroyed2 = false;
  heap<kj::(anonymous_namespace)::Nested,bool&>((kj *)&nested,&destroyed1);
  heap<kj::(anonymous_namespace)::Nested,bool&>((kj *)&local_18,&destroyed2);
  this_00 = &(nested.ptr)->nested;
  Own<kj::(anonymous_namespace)::Nested>::operator=(this_00,&local_18);
  if (local_18.ptr != (Nested *)0x0) {
    local_18.ptr = (Nested *)0x0;
    (**(local_18.disposer)->_vptr_Disposer)();
  }
  if (((destroyed1 != false) || (destroyed2 == true)) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x3c,ERROR,"\"failed: expected \" \"!(destroyed1 || destroyed2)\"",
               (char (*) [45])"failed: expected !(destroyed1 || destroyed2)");
  }
  Own<kj::(anonymous_namespace)::Nested>::operator=(&nested,this_00);
  if (_::Debug::minSeverity < 3 && destroyed1 == false) {
    _::Debug::log<char_const(&)[28]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x3e,ERROR,"\"failed: expected \" \"destroyed1\"",
               (char (*) [28])"failed: expected destroyed1");
  }
  if ((destroyed2 == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x3f,ERROR,"\"failed: expected \" \"!(destroyed2)\"",
               (char (*) [31])"failed: expected !(destroyed2)");
  }
  if (nested.ptr != (Nested *)0x0) {
    nested.ptr = (Nested *)0x0;
    (**(nested.disposer)->_vptr_Disposer)();
  }
  if (((destroyed1 != true) || (destroyed2 == false)) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"destroyed1 && destroyed2\"",
               (char (*) [42])"failed: expected destroyed1 && destroyed2");
  }
  if (nested.ptr != (Nested *)0x0) {
    nested.ptr = (Nested *)0x0;
    (**(nested.disposer)->_vptr_Disposer)();
  }
  return;
}

Assistant:

TEST(Memory, AssignNested) {
  bool destroyed1 = false, destroyed2 = false;
  auto nested = heap<Nested>(destroyed1);
  nested->nested = heap<Nested>(destroyed2);
  EXPECT_FALSE(destroyed1 || destroyed2);
  nested = kj::mv(nested->nested);
  EXPECT_TRUE(destroyed1);
  EXPECT_FALSE(destroyed2);
  nested = nullptr;
  EXPECT_TRUE(destroyed1 && destroyed2);
}